

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VariableSymbols.cpp
# Opt level: O1

void __thiscall slang::ast::VariableSymbol::checkInitializer(VariableSymbol *this)

{
  Scope *pSVar1;
  bool bVar2;
  ulong uVar3;
  Expression *this_00;
  LookupLocation LVar4;
  StaticInitializerVisitor visitor;
  StaticInitializerVisitor local_60;
  ASTContext local_50;
  
  if (((this->super_ValueSymbol).super_Symbol.kind == Variable) && (this->lifetime == Static)) {
    pSVar1 = (this->super_ValueSymbol).super_Symbol.parentScope;
    uVar3 = (ulong)pSVar1->thisSym->kind;
    if ((uVar3 < 0x38) &&
       ((((0x85000000000008U >> (uVar3 & 0x3f) & 1) != 0 &&
         (this_00 = DeclaredType::getInitializer(&(this->super_ValueSymbol).declaredType),
         this_00 != (Expression *)0x0)) && (bVar2 = Expression::bad(this_00), !bVar2)))) {
      LVar4 = LookupLocation::after((Symbol *)this);
      local_60.context = &local_50;
      local_50.lookupIndex = LVar4.index;
      local_50.flags.m_bits = 0;
      local_50.instanceOrProc = (Symbol *)0x0;
      local_50.firstTempVar = (TempVarSymbol *)0x0;
      local_50.randomizeDetails = (RandomizeDetails *)0x0;
      local_50.assertionInstance = (AssertionInstanceDetails *)0x0;
      local_60.sourceVar = (Symbol *)this;
      local_50.scope.ptr = pSVar1;
      Expression::
      visitExpression<slang::ast::Expression_const,slang::ast::StaticInitializerVisitor&>
                (this_00,this_00,&local_60);
    }
  }
  return;
}

Assistant:

void VariableSymbol::checkInitializer() const {
    // Check the initializer expression of static variables
    // for references to other values that have indeterminate
    // initialization order.
    if (kind != SymbolKind::Variable || lifetime != VariableLifetime::Static)
        return;

    auto scope = getParentScope();
    SLANG_ASSERT(scope);

    switch (scope->asSymbol().kind) {
        case SymbolKind::InstanceBody:
        case SymbolKind::GenerateBlock:
        case SymbolKind::Package:
        case SymbolKind::CompilationUnit:
            if (auto init = getInitializer(); init && !init->bad()) {
                ASTContext context(*scope, LookupLocation::after(*this));
                StaticInitializerVisitor visitor(context, *this);
                init->visit(visitor);
            }
            break;
        default:
            break;
    }
}